

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg.c
# Opt level: O0

reg_t * reg_get_by_id(int id,int ver)

{
  list_node_t *local_28;
  list_node_t *node;
  reg_t *table;
  int ver_local;
  int id_local;
  
  node = (list_node_t *)reg_get_table(ver);
  if (node != (list_node_t *)0x0) {
    for (; *(int *)((long)&node->next + 4) != 0; node = (list_node_t *)&node->data) {
      if (*(int *)&node->next == id) {
        return (reg_t *)node;
      }
    }
  }
  local_28 = regs_user.head;
  while( true ) {
    if (local_28 == (list_node_t *)0x0) {
      return (reg_t *)0x0;
    }
    if (((reg_t *)local_28->data)->id == id) break;
    local_28 = local_28->next;
  }
  return (reg_t *)local_28->data;
}

Assistant:

reg_t*
reg_get_by_id(
    int id,
    int ver
) {
    reg_t* table = reg_get_table(ver);
    if (table) {
        while(table->type) {
            if (table->id == id)
                return table;
            ++table;
        }
    }
    list_for_each(&regs_user, table) {
        if (table->id == id)
            return table;
    }
    return NULL;
}